

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

int LiteScript::Syntax::ReadControlSwitch
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer pIVar5;
  ErrorType *in_RCX;
  ErrorType *pEVar6;
  ErrorType *errorType_00;
  pointer pIVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  char *text_00;
  long lVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_78;
  allocator local_69;
  ulong local_68;
  string keyword;
  
  keyword._M_dataplus._M_p = (pointer)&keyword.field_2;
  keyword._M_string_length = 0;
  keyword.field_2._M_local_buf[0] = '\0';
  uVar2 = ReadName(text,&keyword);
  iVar4 = 0;
  if ((uVar2 != 0) && (bVar1 = std::operator!=(&keyword,"switch"), iVar4 = 0, !bVar1)) {
    uVar2 = ReadWhitespace(text + 6);
    if (text[(long)(int)uVar2 + 6] == '(') {
      uVar3 = ReadWhitespace(text + (long)(int)uVar2 + 7);
      iVar8 = uVar2 + uVar3 + 7;
      iVar4 = ReadExpression((Syntax *)(text + iVar8),(char *)instrl,
                             (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                              *)errorType,in_RCX);
      if (iVar4 < 1) {
LAB_0013a2b0:
        if (iVar4 == 0) {
          *errorType = SCRPT_ERROR_EXPRESSION;
          iVar4 = -iVar8;
        }
        else {
          iVar4 = iVar4 - iVar8;
        }
      }
      else {
        uVar2 = ReadWhitespace(text + (iVar8 + iVar4));
        iVar4 = iVar8 + iVar4 + uVar2;
        if (text[iVar4] == ')') {
          uVar2 = ReadWhitespace(text + (long)iVar4 + 1);
          iVar4 = iVar4 + uVar2 + 1;
          if (text[iVar4] == '{') {
            uVar2 = ReadWhitespace(text + (long)iVar4 + 1);
            iVar4 = uVar2 + iVar4 + 1;
            pEVar6 = (ErrorType *)
                     ((long)(instrl->
                            super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(instrl->
                           super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                           )._M_impl.super__Vector_impl_data._M_start);
            local_68 = 0xffffffffffffffff;
            local_78 = 0xffffffffffffffff;
            errorType_00 = pEVar6;
            while( true ) {
              uVar12 = local_78 & 0xffffffff;
              uVar10 = local_68 & 0xffffffff;
              if (text[iVar4] == '}') break;
              uVar2 = ReadWhitespace(text + iVar4);
              if ((int)uVar2 < 1) {
                uVar2 = ReadName(text + iVar4,&keyword);
                if (uVar2 == 0) {
                  *errorType = SCRPT_ERROR_SWITCH_END;
                  goto LAB_0013a5ae;
                }
                bVar1 = std::operator==(&keyword,"case");
                if (!bVar1) {
                  bVar1 = std::operator==(&keyword,"default");
                  if (!bVar1) {
                    *errorType = SCRPT_ERROR_SWITCH_KEYWORDS;
                    goto LAB_0013a5ae;
                  }
                  uVar2 = ReadWhitespace(text + (long)iVar4 + 7);
                  iVar4 = iVar4 + uVar2 + 7;
                  if (text[iVar4] != ':') {
LAB_0013a595:
                    *errorType = SCRPT_ERROR_COLON;
                    goto LAB_0013a2cf;
                  }
                  uVar2 = ReadWhitespace(text + (long)iVar4 + 1);
                  if (-1 < (int)local_68) {
                    Instruction::Instruction
                              ((Instruction *)&local_98,INSTR_JUMP_TO,
                               (int)((ulong)((long)(instrl->
                                                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(instrl->
                                                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 4))
                    ;
                    Instruction::operator=
                              ((instrl->
                               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               )._M_impl.super__Vector_impl_data._M_start + uVar10,
                               (Instruction *)&local_98);
                    Instruction::~Instruction((Instruction *)&local_98);
                  }
                  iVar4 = uVar2 + iVar4 + 1;
                  if (-1 < (int)local_78) {
                    Instruction::Instruction
                              ((Instruction *)&local_98,INSTR_JUMP_ELSE,
                               (int)((ulong)((long)(instrl->
                                                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(instrl->
                                                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 4))
                    ;
                    Instruction::operator=
                              ((instrl->
                               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               )._M_impl.super__Vector_impl_data._M_start + uVar12,
                               (Instruction *)&local_98);
                    Instruction::~Instruction((Instruction *)&local_98);
                  }
                  goto LAB_0013a570;
                }
                uVar2 = ReadWhitespace(text + (long)iVar4 + 4);
                Instruction::Instruction((Instruction *)&local_98,INSTR_VALUE_COPY);
                std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_98);
                iVar8 = iVar4 + uVar2 + 4;
                Instruction::~Instruction((Instruction *)&local_98);
                iVar4 = ReadExpression((Syntax *)(text + iVar8),(char *)instrl,
                                       (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                        *)errorType,errorType_00);
                if (iVar4 < 1) goto LAB_0013a2b0;
                uVar2 = ReadWhitespace(text + (iVar4 + iVar8));
                iVar4 = iVar4 + iVar8 + uVar2;
                if (text[iVar4] != ':') goto LAB_0013a595;
                uVar2 = ReadWhitespace(text + (long)iVar4 + 1);
                Instruction::Instruction((Instruction *)&local_98,INSTR_OP_EQU);
                std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_98);
                Instruction::~Instruction((Instruction *)&local_98);
                local_78 = (long)(instrl->
                                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(instrl->
                                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                Instruction::Instruction((Instruction *)&local_98,INSTR_JUMP_ELSE);
                std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_98);
                iVar4 = iVar4 + 1 + uVar2;
                local_78 = (long)local_78 >> 4;
                Instruction::~Instruction((Instruction *)&local_98);
                if (-1 < (int)local_68) {
                  Instruction::Instruction
                            ((Instruction *)&local_98,INSTR_JUMP_TO,
                             (int)((ulong)((long)(instrl->
                                                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(instrl->
                                                super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                                )._M_impl.super__Vector_impl_data._M_start) >> 4));
                  Instruction::operator=
                            ((instrl->
                             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar10,
                             (Instruction *)&local_98);
                  Instruction::~Instruction((Instruction *)&local_98);
                }
                while( true ) {
                  if (text[iVar4] == '}') break;
                  text_00 = text + iVar4;
                  uVar2 = ReadName(text_00,&keyword);
                  if ((uVar2 != 0) &&
                     ((bVar1 = std::operator!=(&keyword,"case"), !bVar1 ||
                      (bVar1 = std::operator!=(&keyword,"default"), !bVar1)))) break;
                  uVar2 = ReadWhitespace(text_00);
                  if (((int)uVar2 < 1) &&
                     (uVar2 = ReadInstruction(text_00,instrl,errorType), (int)uVar2 < 1))
                  goto LAB_0013a57f;
                  iVar4 = iVar4 + uVar2;
                }
                local_68 = (long)(instrl->
                                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(instrl->
                                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                Instruction::Instruction((Instruction *)&local_98,INSTR_JUMP_TO);
                std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_98);
                local_68 = local_68 >> 4;
                Instruction::~Instruction((Instruction *)&local_98);
                if (-1 < (int)local_78) {
                  Instruction::Instruction
                            ((Instruction *)&local_98,INSTR_JUMP_ELSE,
                             (int)((ulong)((long)(instrl->
                                                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(instrl->
                                                super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                                )._M_impl.super__Vector_impl_data._M_start) >> 4));
                  Instruction::operator=
                            ((instrl->
                             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             )._M_impl.super__Vector_impl_data._M_start +
                             ((uint)local_78 & 0x7fffffff),(Instruction *)&local_98);
                  Instruction::~Instruction((Instruction *)&local_98);
                }
              }
              else {
                iVar4 = iVar4 + uVar2;
              }
            }
LAB_0013a2ee:
            pIVar5 = (instrl->
                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pIVar7 = (instrl->
                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            if (-1 < (int)local_68) {
              Instruction::Instruction
                        ((Instruction *)&local_98,INSTR_JUMP_TO,
                         (int)((ulong)((long)pIVar7 - (long)pIVar5) >> 4));
              Instruction::operator=
                        ((instrl->
                         super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar10,
                         (Instruction *)&local_98);
              Instruction::~Instruction((Instruction *)&local_98);
              pIVar5 = (instrl->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pIVar7 = (instrl->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            if (-1 < (int)local_78) {
              Instruction::Instruction
                        ((Instruction *)&local_98,INSTR_JUMP_ELSE,
                         (int)((ulong)((long)pIVar7 - (long)pIVar5) >> 4));
              Instruction::operator=
                        ((instrl->
                         super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar12,
                         (Instruction *)&local_98);
              Instruction::~Instruction((Instruction *)&local_98);
              pIVar5 = (instrl->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pIVar7 = (instrl->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            lVar9 = (long)(int)((ulong)pEVar6 >> 4);
            iVar8 = (int)((ulong)((long)pIVar7 - (long)pIVar5) >> 4);
            lVar11 = lVar9 << 4;
            for (; lVar9 < iVar8; lVar9 = lVar9 + 1) {
              pIVar5 = (instrl->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (((&pIVar5->code)[lVar11] == ';') && ((&pIVar5->comp_type)[lVar11] == '\x04')) {
                std::__cxx11::string::string
                          ((string *)&local_98,*(char **)((long)&pIVar5->comp_value + lVar11),
                           &local_69);
                bVar1 = std::operator==(&local_98,"break");
                std::__cxx11::string::~string((string *)&local_98);
                if (bVar1) {
                  Instruction::Instruction((Instruction *)&local_98,INSTR_JUMP_TO,iVar8);
                  Instruction::operator=
                            ((Instruction *)
                             (&((instrl->
                                super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                )._M_impl.super__Vector_impl_data._M_start)->code + lVar11),
                             (Instruction *)&local_98);
                  Instruction::~Instruction((Instruction *)&local_98);
                }
              }
              lVar11 = lVar11 + 0x10;
            }
            Instruction::Instruction((Instruction *)&local_98,INSTR_VALUE_POP);
            std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
            emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_98);
            Instruction::~Instruction((Instruction *)&local_98);
            iVar4 = iVar4 + 1;
            goto LAB_0013a446;
          }
          *errorType = SCRPT_ERROR_BRACE_OPEN;
        }
        else {
          *errorType = SCRPT_ERROR_PARENTHESIS_CLOSE;
        }
LAB_0013a2cf:
        iVar4 = -iVar4;
      }
    }
    else {
      *errorType = SCRPT_ERROR_PARENTHESIS_OPEN;
      iVar4 = -6 - uVar2;
    }
  }
  goto LAB_0013a446;
LAB_0013a570:
  if (text[iVar4] == '}') goto LAB_0013a2ee;
  uVar2 = ReadWhitespace(text + iVar4);
  if (((int)uVar2 < 1) && (uVar2 = ReadInstruction(text + iVar4,instrl,errorType), (int)uVar2 < 1))
  goto LAB_0013a57f;
  iVar4 = iVar4 + uVar2;
  goto LAB_0013a570;
LAB_0013a57f:
  if (uVar2 == 0) {
    *errorType = SCRPT_ERROR_UNKNOW;
LAB_0013a5ae:
    iVar4 = -iVar4;
  }
  else {
    iVar4 = uVar2 - iVar4;
  }
LAB_0013a446:
  std::__cxx11::string::~string((string *)&keyword);
  return iVar4;
}

Assistant:

int LiteScript::Syntax::ReadControlSwitch(const char *text, std::vector<Instruction> &instrl,
                                          Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "switch")
        return 0;
    int i = 6, tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '(') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ')') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '{') {
        errorType = Script::ErrorType::SCRPT_ERROR_BRACE_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jtn = -1, jen = -1, jb = instrl.size();
    while (text[i] != '}') {
        if ((tmp = (int)ReadWhitespace(text + i)) > 0)
            i += tmp;
        else if (ReadName(text + i, keyword) > 0) {
            if (keyword == "case") {
                i += 4;
                i += (int) ReadWhitespace(text + i);
                instrl.push_back(Instruction(InstrCode::INSTR_VALUE_COPY));
                if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
                    if (tmp != 0)
                        return tmp - i;
                    else {
                        errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                        return -i;
                    }
                }
                i += tmp;
                i += (int) ReadWhitespace(text + i);
                if (text[i] != ':') {
                    errorType = Script::ErrorType::SCRPT_ERROR_COLON;
                    return -i;
                }
                ++i;
                i += (int) ReadWhitespace(text + i);
                instrl.push_back((Instruction(InstrCode::INSTR_OP_EQU)));
                jen = instrl.size();
                instrl.push_back((Instruction(InstrCode::INSTR_JUMP_ELSE)));
                if (jtn >= 0)
                    instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
                while (text[i] != '}' && (ReadName(text + i, keyword) == 0 || (keyword != "case" && keyword != "default"))){
                    if ((tmp = (int)ReadWhitespace(text + i)) > 0)
                        i += tmp;
                    else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
                        i += tmp;
                    else {
                        if (tmp != 0)
                            return tmp - i;
                        else {
                            errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                            return -i;
                        }
                    }
                }
                jtn = instrl.size();
                instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
                if (jen >= 0)
                    instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
            }
            else if (keyword == "default") {
                i += 7;
                i += (int) ReadWhitespace(text + i);
                if (text[i] != ':') {
                    errorType = Script::ErrorType::SCRPT_ERROR_COLON;
                    return -i;
                }
                ++i;
                i += (int) ReadWhitespace(text + i);
                if (jtn >= 0)
                    instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
                if (jen >= 0)
                    instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
                while (text[i] != '}') {
                    if ((tmp = (int)ReadWhitespace(text + i)) > 0)
                        i += tmp;
                    else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
                        i += tmp;
                    else {
                        if (tmp != 0)
                            return tmp - i;
                        else {
                            errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                            return -i;
                        }
                    }
                }
                break;
            }
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_SWITCH_KEYWORDS;
                return -i;
            }
        }
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_SWITCH_END;
            return -i;
        }
    }
    if (text[i] != '}') {
        errorType = Script::ErrorType::SCRPT_ERROR_BRACE_CLOSE;
        return -i;
    }
    if (jtn >= 0)
        instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
    if (jen >= 0)
        instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
    for (int it = jb, sz = instrl.size(); it < sz; it++) {
        if (instrl[it].code == InstrCode::INSTR_JUMP_TO &&
            instrl[it].comp_type == Instruction::CompType::COMP_TYPE_STRING &&
            std::string(instrl[it].comp_value.v_string) == "break")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, sz);
    }
    instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
    return i + 1;
}